

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O2

void __thiscall Field::generateCondition(Field *this,SeparatedListHelper *out)

{
  ostream *poVar1;
  
  if (this->match == true) {
    poVar1 = SeparatedListHelper::next(out);
    poVar1 = std::operator<<(poVar1,"(insn & 0x");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,") == 0x");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    return;
  }
  return;
}

Assistant:

void Field::generateCondition(SeparatedListHelper& out)
{
    if(match)
    {
        uint32_t mask = 2*(1 << (31-from)) - (1 << (32-to));
        uint32_t svalue = value << (32-to);
        out.next() << "(insn & 0x" << std::hex << mask << ") == 0x" << std::hex << svalue;
    }
}